

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystem.cpp
# Opt level: O3

void __thiscall solitaire::graphics::SDLGraphicsSystem::renderFrame(SDLGraphicsSystem *this)

{
  Wrapper *pWVar1;
  int iVar2;
  runtime_error *this_00;
  
  if (this->isWindowCreated == false) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Cannot render frame when window not created");
  }
  else {
    pWVar1 = (this->sdl)._M_t.
             super___uniq_ptr_impl<solitaire::SDL::interfaces::Wrapper,_std::default_delete<solitaire::SDL::interfaces::Wrapper>_>
             ._M_t.
             super__Tuple_impl<0UL,_solitaire::SDL::interfaces::Wrapper_*,_std::default_delete<solitaire::SDL::interfaces::Wrapper>_>
             .super__Head_base<0UL,_solitaire::SDL::interfaces::Wrapper_*,_false>._M_head_impl;
    (*pWVar1->_vptr_Wrapper[0xf])(pWVar1,&this->renderer);
    pWVar1 = (this->sdl)._M_t.
             super___uniq_ptr_impl<solitaire::SDL::interfaces::Wrapper,_std::default_delete<solitaire::SDL::interfaces::Wrapper>_>
             ._M_t.
             super__Tuple_impl<0UL,_solitaire::SDL::interfaces::Wrapper_*,_std::default_delete<solitaire::SDL::interfaces::Wrapper>_>
             .super__Head_base<0UL,_solitaire::SDL::interfaces::Wrapper_*,_false>._M_head_impl;
    iVar2 = (*pWVar1->_vptr_Wrapper[0xd])(pWVar1,&this->renderer);
    if (iVar2 == 0) {
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Cannot clear frame");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SDLGraphicsSystem::renderFrame() const {
    if (not isWindowCreated)
        throw std::runtime_error {"Cannot render frame when window not created"};

    sdl->renderPresent(renderer);

    if (sdl->renderClear(renderer))
        throw std::runtime_error {"Cannot clear frame"};
}